

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O2

Task * __thiscall tf::Task::precede<tf::Task&>(Task *this,Task *tasks)

{
  Node::_precede(this->_node,tasks->_node);
  return this;
}

Assistant:

Task& Task::precede(Ts&&... tasks) {
  (_node->_precede(tasks._node), ...);
  //_precede(std::forward<Ts>(tasks)...);
  return *this;
}